

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O2

int * __thiscall
pbrt::BufferCache<int>::LookupOrAdd(BufferCache<int> *this,vector<int,_std::allocator<int>_> *buf)

{
  memory_resource *pmVar1;
  int iVar2;
  iterator iVar3;
  undefined4 extraout_var;
  pointer __src;
  size_t __n;
  pointer piVar4;
  long in_FS_OFFSET;
  value_type local_48;
  Buffer lookupBuffer;
  int *__dest;
  
  *(long *)(in_FS_OFFSET + -0x2f8) = *(long *)(in_FS_OFFSET + -0x2f8) + 1;
  std::mutex::lock(&this->mutex);
  lookupBuffer.ptr =
       (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  ;
  lookupBuffer.size =
       (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish - (long)lookupBuffer.ptr >> 2;
  iVar3 = std::
          _Hashtable<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::Buffer,_std::allocator<pbrt::BufferCache<int>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_pbrt::BufferCache<int>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->cache)._M_h,&lookupBuffer);
  if (iVar3.super__Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true>._M_cur ==
      (__node_type *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])
                      (pmVar1,(long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start,4);
    __dest = (int *)CONCAT44(extraout_var,iVar2);
    __src = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
    __n = (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish - (long)__src;
    piVar4 = __src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
      __src = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish;
      piVar4 = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
    this->bytesUsed = this->bytesUsed + ((long)__src - (long)piVar4);
    local_48.size = (long)__src - (long)piVar4 >> 2;
    local_48.ptr = __dest;
    std::__detail::
    _Insert<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::Buffer,_std::allocator<pbrt::BufferCache<int>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_pbrt::BufferCache<int>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::Buffer,_std::allocator<pbrt::BufferCache<int>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_pbrt::BufferCache<int>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&this->cache,&local_48);
  }
  else {
    *(long *)(in_FS_OFFSET + -0x300) = *(long *)(in_FS_OFFSET + -0x300) + 1;
    *(long *)(in_FS_OFFSET + -0x308) =
         (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_end_of_storage +
         (*(long *)(in_FS_OFFSET + -0x308) -
         (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start);
    __dest = *(int **)((long)iVar3.super__Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true>.
                             _M_cur + 8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return __dest;
}

Assistant:

const T *LookupOrAdd(const std::vector<T> &buf) {
        ++nBufferCacheLookups;
        std::lock_guard<std::mutex> lock(mutex);
        // Return pointer to data if _buf_ contents is already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        if (auto iter = cache.find(lookupBuffer); iter != cache.end()) {
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.capacity() * sizeof(T);
            return iter->ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        cache.insert(Buffer(ptr, buf.size()));
        return ptr;
    }